

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O3

bool __thiscall CaDiCaL::Internal::disconnect_proof_tracer(Internal *this,StatTracer *tracer)

{
  StatTracer **__src;
  StatTracer **ppSVar1;
  __normal_iterator<CaDiCaL::StatTracer_**,_std::vector<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_>_>
  __dest;
  StatTracer **ppSVar2;
  
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<CaDiCaL::StatTracer**,std::vector<CaDiCaL::StatTracer*,std::allocator<CaDiCaL::StatTracer*>>>,__gnu_cxx::__ops::_Iter_equals_val<CaDiCaL::StatTracer*const>>
                     ((this->stat_tracers).
                      super__Vector_base<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (this->stat_tracers).
                      super__Vector_base<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  ppSVar1 = (this->stat_tracers).
            super__Vector_base<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (__dest._M_current != ppSVar1) {
    __src = __dest._M_current + 1;
    ppSVar2 = ppSVar1;
    if (__src != ppSVar1) {
      memmove(__dest._M_current,__src,(long)ppSVar1 - (long)__src);
      ppSVar2 = (this->stat_tracers).
                super__Vector_base<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    (this->stat_tracers).
    super__Vector_base<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar2 + -1;
    Proof::disconnect(this->proof,(Tracer *)tracer);
  }
  return __dest._M_current != ppSVar1;
}

Assistant:

bool Internal::disconnect_proof_tracer (StatTracer *tracer) {
  auto it = std::find (stat_tracers.begin (), stat_tracers.end (), tracer);
  if (it != stat_tracers.end ()) {
    stat_tracers.erase (it);
    assert (proof);
    proof->disconnect (tracer);
    return true;
  }
  return false;
}